

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::base_html_input::render_input(base_html_input *this)

{
  form_context *in_RSI;
  
  render_input((base_html_input *)
               ((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-10]),in_RSI)
  ;
  return;
}

Assistant:

void base_html_input::render_input(form_context &context)
{
	auto_generate(&context);

	std::ostream &output=context.out();
	if(context.widget_part() == first_part) {
		output<<"<input type=\""<<type_<<"\" ";
		render_attributes(context);
		render_value(context);
	}
	else {
		if(context.html() ==  as_xhtml)
			output<<" />";
		else
			output<<" >";
	}
}